

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::InitializeCoreImage_TTD(ScriptContext *this)

{
  HeapAllocator *pHVar1;
  ScriptContextTTD *this_00;
  RuntimeContextInfo *this_01;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  TrackAllocData data;
  undefined1 local_58 [8];
  EnterScriptObject __enterScriptObject;
  
  if (this->TTDWellKnownInfo == (RuntimeContextInfo *)0x0) {
    auStack_98 = (undefined1  [8])&TTD::ScriptContextTTD::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2cb70d5;
    data.filename = (char *)CONCAT44(data.filename._4_4_,0xc4a);
    pHVar1 = Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)auStack_98);
    this_00 = (ScriptContextTTD *)Memory::HeapAllocator::AllocT<true>(pHVar1,0x128);
    TTD::ScriptContextTTD::ScriptContextTTD(this_00,this);
    this->TTDContextInfo = this_00;
    auStack_98 = (undefined1  [8])&TTD::RuntimeContextInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2cb70d5;
    data.filename = (char *)CONCAT44(data.filename._4_4_,0xc4b);
    pHVar1 = Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)auStack_98);
    this_01 = (RuntimeContextInfo *)Memory::HeapAllocator::AllocT<true>(pHVar1,0x170);
    TTD::RuntimeContextInfo::RuntimeContextInfo(this_01);
    this->TTDWellKnownInfo = this_01;
    data.filename = (char *)0x0;
    data.line = 0;
    data._36_4_ = 0;
    data.plusSize = 0;
    data.count = 0;
    auStack_98 = (undefined1  [8])0x0;
    data.typeinfo = (type_info *)0x0;
    EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_58,this,(ScriptEntryExitRecord *)auStack_98,unaff_retaddr,
               &stack0x00000000,true,true,true);
    OnScriptStart(this,true,true);
    EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_58);
    TTD::RuntimeContextInfo::GatherKnownObjectToPathMap(this->TTDWellKnownInfo,this);
    EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
    return;
  }
  TTDAbort_unrecoverable_error("This should only happen once!!!");
}

Assistant:

void ScriptContext::InitializeCoreImage_TTD()
    {
        TTDAssert(this->TTDWellKnownInfo == nullptr, "This should only happen once!!!");

        this->TTDContextInfo = TT_HEAP_NEW(TTD::ScriptContextTTD, this);
        this->TTDWellKnownInfo = TT_HEAP_NEW(TTD::RuntimeContextInfo);

        BEGIN_ENTER_SCRIPT(this, true, true, true)
        {
            this->TTDWellKnownInfo->GatherKnownObjectToPathMap(this);
        }
        END_ENTER_SCRIPT
    }